

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O1

bool anon_unknown.dwarf_92da1::class_or_subclass_have_properties(MetaClass *top)

{
  pointer psVar1;
  MetaClass *top_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar2;
  bool bVar3;
  pointer psVar4;
  
  if (top == (MetaClass *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if ((top->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (top->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar1 = (top->subclasses).
               super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = (top->subclasses).
                    super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; bVar3 = psVar4 != psVar1, bVar3;
          psVar4 = psVar4 + 1) {
        top_00 = (psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this = (psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
        ;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        bVar2 = class_or_subclass_have_properties(top_00);
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if (bVar2) {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool class_or_subclass_have_properties(MetaClass *top) {
  if (!top)
    return false;
  if (top->properties.size() != 0) {
    return true;
  }

  for (auto child : top->subclasses) {
    if (class_or_subclass_have_properties(child.get())) {
      return true;
    }
  }
  return false;
}